

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O2

void copy_suite::run(void)

{
  copy_null();
  copy_boolean();
  copy_integer();
  copy_real();
  copy_string();
  copy_array();
  copy_array_nested();
  copy_map();
  copy_map_nested();
  return;
}

Assistant:

void run()
{
    copy_null();
    copy_boolean();
    copy_integer();
    copy_real();
    copy_string();
    copy_array();
    copy_array_nested();
    copy_map();
    copy_map_nested();
}